

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testoled.cxx
# Opt level: O3

int main(void)

{
  uint uVar1;
  result_type rVar2;
  result_type rVar3;
  PressedKey PVar4;
  size_t __i;
  long lVar5;
  int iVar6;
  ulong uVar7;
  OledPoint p;
  uniform_int_distribution<int> yDistribution;
  uniform_int_distribution<int> xDistribution;
  LinuxKeys linuxKeys;
  OledI2C oled;
  random_device randomDevice;
  mt19937 randomGenerator;
  param_type local_2c08;
  param_type local_2c00;
  LinuxKeys local_2bf8;
  OledI2C local_2bb8;
  undefined1 local_2740 [5000];
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  local_13b8;
  
  local_2740._0_8_ = (long)local_2740 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2740,"/dev/i2c-1","");
  SSD1306::OledI2C::OledI2C(&local_2bb8,(string *)local_2740,'<');
  if (local_2740._0_8_ != (long)local_2740 + 0x10) {
    operator_delete((void *)local_2740._0_8_,local_2740._16_8_ + 1);
  }
  local_2740._0_4_ = 0x20;
  local_2740._4_4_ = 0x18;
  SSD1306::drawString8x16
            ((OledPoint *)local_2740,anon_var_dwarf_24fd,Set,&local_2bb8.super_OledPixel);
  SSD1306::OledI2C::displayUpdate(&local_2bb8);
  LinuxKeys::LinuxKeys(&local_2bf8);
  std::random_device::random_device((random_device *)local_2740);
  uVar1 = std::random_device::_M_getval();
  local_13b8._M_x[0] = (unsigned_long)uVar1;
  lVar5 = 1;
  uVar7 = local_13b8._M_x[0];
  do {
    uVar7 = (ulong)(((uint)(uVar7 >> 0x1e) ^ (uint)uVar7) * 0x6c078965 + (int)lVar5);
    local_13b8._M_x[lVar5] = uVar7;
    lVar5 = lVar5 + 1;
  } while (lVar5 != 0x270);
  local_13b8._M_p = 0x270;
  local_2c00._M_a = 0;
  local_2c00._M_b = 0x7f;
  local_2c08._M_a = 0;
  local_2c08._M_b = 0x3f;
  uVar7 = 0;
  while ((int)uVar7 != 0x1b) {
    PVar4 = LinuxKeys::pressed(&local_2bf8);
    uVar7 = (ulong)PVar4 >> 0x20;
    iVar6 = PVar4.key;
    if (iVar6 < 0x69) {
      if (iVar6 == 0x2b) {
        SSD1306::OledI2C::displayOn(&local_2bb8);
      }
      else if (iVar6 == 0x2d) {
        SSD1306::OledI2C::displayOff(&local_2bb8);
      }
    }
    else if (iVar6 == 0x69) {
      SSD1306::OledI2C::displayInverse(&local_2bb8);
    }
    else if (iVar6 == 0x6e) {
      SSD1306::OledI2C::displayNormal(&local_2bb8);
    }
    rVar2 = std::uniform_int_distribution<int>::operator()
                      ((uniform_int_distribution<int> *)&local_2c00,&local_13b8,&local_2c00);
    rVar3 = std::uniform_int_distribution<int>::operator()
                      ((uniform_int_distribution<int> *)&local_2c08,&local_13b8,&local_2c08);
    p.m_y = rVar3;
    p.m_x = rVar2;
    SSD1306::OledI2C::xorPixel(&local_2bb8,p);
    SSD1306::OledI2C::displayUpdate(&local_2bb8);
  }
  SSD1306::OledI2C::clear(&local_2bb8);
  SSD1306::OledI2C::displayUpdate(&local_2bb8);
  std::random_device::_M_fini();
  LinuxKeys::~LinuxKeys(&local_2bf8);
  SSD1306::OledI2C::~OledI2C(&local_2bb8);
  return 0;
}

Assistant:

int
main()
{
    try
    {
        SSD1306::OledI2C oled{"/dev/i2c-1", 0x3C};
        drawString8x16(SSD1306::OledPoint{32, 24},
                       "Oled I" "\xFD" "C",
                       SSD1306::PixelStyle::Set,
                       oled);
        oled.displayUpdate();

        //-----------------------------------------------------------------

        LinuxKeys linuxKeys;
        LinuxKeys::PressedKey key;

        //-----------------------------------------------------------------


        std::random_device randomDevice;
        std::mt19937 randomGenerator{randomDevice()};
        std::uniform_int_distribution<> xDistribution{0, oled.width() - 1};
        std::uniform_int_distribution<> yDistribution{0, oled.height() - 1};


        //-----------------------------------------------------------------

        while(key.key != 27)
        {
            key = linuxKeys.pressed();

            switch (key.key)
            {
            case 'i':

                oled.displayInverse();

                break;

            case 'n':

                oled.displayNormal();

                break;

            case '+':

                oled.displayOn();

                break;

            case '-':

                oled.displayOff();

                break;
            }

            SSD1306::OledPoint p{xDistribution(randomGenerator),
                                 yDistribution(randomGenerator)};

            oled.xorPixel(p);
            oled.displayUpdate();
        }

        oled.clear();
        oled.displayUpdate();
    }
    catch (std::exception& e)
    {
        std::cerr << e.what() << "\n";
    }

    return 0;
}